

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void bloaty::macho::
     ParseMachOHeader<bloaty::macho::ParseSymbols(std::basic_string_view<char,std::char_traits<char>>,std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>*,bloaty::RangeSink*)::__0>
               (string_view macho_file,RangeSink *overhead_sink,
               anon_class_16_2_b2afbd3e *loadcmd_func)

{
  uint32_t uVar1;
  mach_header_64 *pmVar2;
  load_command *plVar3;
  mach_header *pmVar4;
  char *extraout_RDX;
  char *pcVar5;
  char *extraout_RDX_00;
  macho *this;
  char *in_R8;
  bool bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  string_view data_04;
  string_view data_05;
  string_view data_06;
  string_view data_07;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  LoadCommand local_68;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  data._M_len = macho_file._M_str;
  this = (macho *)macho_file._M_len;
  data._M_str = (char *)overhead_sink;
  uVar1 = ReadMagic(this,data);
  local_78 = macho_file;
  local_40._M_len = (size_t)this;
  local_40._M_str = data._M_len;
  if (uVar1 == 0xfeedface) {
    pmVar4 = GetStructPointerAndAdvance<mach_header>(&local_78);
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,0x1c);
    data_06._M_str = in_R8;
    data_06._M_len = (size_t)bVar7._M_str;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)bVar7._M_len,
                     data_06);
    uVar1 = pmVar4->ncmds;
    pcVar5 = extraout_RDX_00;
    while (bVar6 = uVar1 != 0, uVar1 = uVar1 - 1, bVar6) {
      data_02._M_str = pcVar5;
      data_02._M_len = (size_t)local_78._M_str;
      plVar3 = GetStructPointer<load_command>((macho *)local_78._M_len,data_02);
      if (plVar3->cmdsize == 0) goto LAB_00190e1c;
      local_68.file_data._M_len = 0;
      local_68.file_data._M_str = (char *)0x0;
      local_68.command_data = (string_view)ZEXT816(0);
      local_68.is64bit = false;
      local_68.cmd = plVar3->cmd;
      data_03._M_str = (char *)0x0;
      data_03._M_len = (size_t)local_78._M_str;
      local_68.command_data =
           StrictSubstr((bloaty *)local_78._M_len,data_03,(ulong)plVar3->cmdsize,(size_t)in_R8);
      local_68.file_data._M_len = local_40._M_len;
      local_68.file_data._M_str = local_40._M_str;
      ParseSymbols::anon_class_16_2_b2afbd3e::operator()(loadcmd_func,&local_68);
      data_07._M_str = in_R8;
      data_07._M_len = (size_t)local_68.command_data._M_str;
      MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",
                       (char *)local_68.command_data._M_len,data_07);
      local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_78,(ulong)plVar3->cmdsize,0xffffffffffffffff);
      pcVar5 = local_78._M_str;
    }
  }
  else {
    if (uVar1 != 0xfeedfacf) {
      if ((uVar1 != 0xcefaedfe) && (uVar1 != 0xcffaedfe)) {
        Throw("Corrupt Mach-O file",0x99);
      }
      Throw("We don\'t support cross-endian Mach-O files.",0x97);
    }
    pmVar2 = GetStructPointerAndAdvance<mach_header_64>(&local_78);
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,0x20);
    data_04._M_str = in_R8;
    data_04._M_len = (size_t)bVar7._M_str;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)bVar7._M_len,
                     data_04);
    uVar1 = pmVar2->ncmds;
    pcVar5 = extraout_RDX;
    while (bVar6 = uVar1 != 0, uVar1 = uVar1 - 1, bVar6) {
      data_00._M_str = pcVar5;
      data_00._M_len = (size_t)local_78._M_str;
      plVar3 = GetStructPointer<load_command>((macho *)local_78._M_len,data_00);
      if (plVar3->cmdsize == 0) {
LAB_00190e1c:
        Throw("Mach-O load command had zero size.",0x66);
      }
      local_68.file_data._M_len = 0;
      local_68.file_data._M_str = (char *)0x0;
      local_68.command_data = (string_view)ZEXT816(0);
      local_68.is64bit = true;
      local_68.cmd = plVar3->cmd;
      data_01._M_str = (char *)0x0;
      data_01._M_len = (size_t)local_78._M_str;
      local_68.command_data =
           StrictSubstr((bloaty *)local_78._M_len,data_01,(ulong)plVar3->cmdsize,(size_t)in_R8);
      local_68.file_data._M_len = local_40._M_len;
      local_68.file_data._M_str = local_40._M_str;
      ParseSymbols::anon_class_16_2_b2afbd3e::operator()(loadcmd_func,&local_68);
      data_05._M_str = in_R8;
      data_05._M_len = (size_t)local_68.command_data._M_str;
      MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",
                       (char *)local_68.command_data._M_len,data_05);
      local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_78,(ulong)plVar3->cmdsize,0xffffffffffffffff);
      pcVar5 = local_78._M_str;
    }
  }
  return;
}

Assistant:

void ParseMachOHeader(string_view macho_file, RangeSink* overhead_sink,
                      Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(macho_file);
  switch (magic) {
    case MH_MAGIC:
      // We don't expect to see many 32-bit binaries out in the wild.
      // Apple is aggressively phasing out support for 32-bit binaries:
      //   https://www.macrumors.com/2017/06/06/apple-to-phase-out-32-bit-mac-apps/
      //
      // Still, you can build 32-bit binaries as of this writing, and
      // there are existing 32-bit binaries floating around, so we might
      // as well support them.
      ParseMachOHeaderImpl<mach_header>(macho_file, overhead_sink,
                                        std::forward<Func>(loadcmd_func));
      break;
    case MH_MAGIC_64:
      ParseMachOHeaderImpl<mach_header_64>(
          macho_file, overhead_sink, std::forward<Func>(loadcmd_func));
      break;
    case MH_CIGAM:
    case MH_CIGAM_64:
      // OS X and Darwin currently only run on x86/x86-64 (little-endian
      // platforms), so we expect basically all Mach-O files to be
      // little-endian.  Additionally, pretty much all CPU architectures
      // are little-endian these days.  ARM has the option to be
      // big-endian, but I can't find any OS that is actually compiled to
      // use big-endian mode.  debian-mips is the only big-endian OS I can
      // find (and maybe SPARC).
      //
      // All of this is to say, this case should only happen if you are
      // running Bloaty on debian-mips.  I consider that uncommon enough
      // (and hard enough to test) that we don't support this until there
      // is a demonstrated need.
      THROW("We don't support cross-endian Mach-O files.");
    default:
      THROW("Corrupt Mach-O file");
  }
}